

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O3

void __thiscall
crnlib::Resampler::scale_y_mov
          (Resampler *this,Sample *Ptmp,Sample *Psrc,Resample_Real weight,int dst_x)

{
  long lVar1;
  int i;
  uint uVar2;
  
  if (0 < dst_x) {
    uVar2 = dst_x + 1;
    lVar1 = 0;
    do {
      *(float *)((long)Ptmp + lVar1) = *(float *)((long)Psrc + lVar1) * weight;
      uVar2 = uVar2 - 1;
      lVar1 = lVar1 + 4;
    } while (1 < uVar2);
  }
  return;
}

Assistant:

void Resampler::scale_y_mov(Sample* Ptmp, const Sample* Psrc, Resample_Real weight, int dst_x) {
  int i;

#if CRNLIB_RESAMPLER_DEBUG_OPS
  total_ops += dst_x;
#endif

  // Not += because temp buf wasn't cleared.
  for (i = dst_x; i > 0; i--)
    *Ptmp++ = *Psrc++ * weight;
}